

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O0

void __thiscall
wasm::Localizer::Localizer(Localizer *this,Expression *input,Function *func,Module *wasm)

{
  Index IVar1;
  LocalSet *pLVar2;
  Builder local_48;
  uintptr_t local_40;
  LocalSet *local_38;
  LocalSet *set;
  LocalGet *get;
  Module *wasm_local;
  Function *func_local;
  Expression *input_local;
  Localizer *this_local;
  
  this->expr = input;
  get = (LocalGet *)wasm;
  wasm_local = (Module *)func;
  func_local = (Function *)input;
  input_local = (Expression *)this;
  set = (LocalSet *)Expression::dynCast<wasm::LocalGet>(this->expr);
  if (set == (LocalSet *)0x0) {
    local_38 = Expression::dynCast<wasm::LocalSet>(this->expr);
    if (local_38 == (LocalSet *)0x0) {
      local_40 = (this->expr->type).id;
      IVar1 = Builder::addVar((Function *)wasm_local,(Type)local_40);
      this->index = IVar1;
      Builder::Builder(&local_48,(Module *)get);
      pLVar2 = Builder::makeLocalTee(&local_48,this->index,this->expr,(Type)(this->expr->type).id);
      this->expr = (Expression *)pLVar2;
    }
    else {
      this->index = local_38->index;
    }
  }
  else {
    this->index = set->index;
  }
  return;
}

Assistant:

Localizer(Expression* input, Function* func, Module* wasm) {
    expr = input;
    if (auto* get = expr->dynCast<LocalGet>()) {
      index = get->index;
    } else if (auto* set = expr->dynCast<LocalSet>()) {
      index = set->index;
    } else {
      index = Builder::addVar(func, expr->type);
      expr = Builder(*wasm).makeLocalTee(index, expr, expr->type);
    }
  }